

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O1

int format_octal(int64_t v,char *p,int s)

{
  int iVar1;
  
  if (v < 0) {
    if (s < 1) {
      return -1;
    }
    iVar1 = 0x30;
  }
  else {
    p = p + s;
    if (0 < s) {
      iVar1 = s + 1;
      do {
        p[-1] = (byte)v & 7 | 0x30;
        p = p + -1;
        v = (ulong)v >> 3;
        iVar1 = iVar1 + -1;
      } while (1 < iVar1);
    }
    if (v == 0) {
      return 0;
    }
    if (s < 1) {
      return -1;
    }
    iVar1 = 0x37;
  }
  memset(p,iVar1,(ulong)(uint)s);
  return -1;
}

Assistant:

static int
format_octal(int64_t v, char *p, int s)
{
	int len;

	len = s;

	/* Octal values can't be negative, so use 0. */
	if (v < 0) {
		while (len-- > 0)
			*p++ = '0';
		return (-1);
	}

	p += s;		/* Start at the end and work backwards. */
	while (s-- > 0) {
		*--p = (char)('0' + (v & 7));
		v >>= 3;
	}

	if (v == 0)
		return (0);

	/* If it overflowed, fill field with max value. */
	while (len-- > 0)
		*p++ = '7';

	return (-1);
}